

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qcombobox_p.cpp
# Opt level: O3

void QComboBoxPrivateScroller::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  long in_FS_OFFSET;
  undefined4 local_2c;
  void *local_28;
  undefined4 *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (_id == 0 && _c == InvokeMetaMethod) {
    local_2c = *_a[1];
    local_20 = &local_2c;
    local_28 = (void *)0x0;
    QMetaObject::activate(_o,&staticMetaObject,0,&local_28);
  }
  if (((_c == IndexOfMethod) && (*_a[1] == doScroll)) && (*(long *)((long)_a[1] + 8) == 0)) {
    *(undefined4 *)*_a = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QComboBoxPrivateScroller::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QComboBoxPrivateScroller *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->doScroll((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QComboBoxPrivateScroller::*)(int )>(_a, &QComboBoxPrivateScroller::doScroll, 0))
            return;
    }
}